

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

void ImGui::TableHeader(char *label)

{
  ImVec2 *pIVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  int column_n;
  ImGuiWindow *this;
  ImGuiTable *table;
  ImVec2 IVar4;
  ImDrawList *draw_list;
  ImVec2 IVar5;
  bool bVar6;
  ImGuiID id;
  ImU32 IVar7;
  ImGuiSortDirection sort_direction;
  char *text_end;
  ImGuiTableColumn *pIVar8;
  ImGuiContext *pIVar9;
  ImGuiTableColumn *column;
  char *text;
  uint uVar10;
  uint uVar11;
  float fVar12;
  float fVar13;
  ulong uVar14;
  float fVar15;
  ImRect IVar16;
  bool held;
  bool hovered;
  char local_f5;
  float local_f4;
  ImGuiContext *local_f0;
  long local_e8;
  char sort_order_suf [4];
  float local_d8;
  float local_c8;
  float fStack_c4;
  float local_b8;
  float fStack_b4;
  float local_98;
  float fStack_94;
  ImVec2 label_pos;
  ImVec2 label_size;
  ImVec2 local_60;
  undefined1 local_58 [16];
  ImRect local_40;
  
  this = GImGui->CurrentWindow;
  if (this->SkipItems != false) {
    return;
  }
  local_f0 = GImGui;
  table = GImGui->CurrentTable;
  column_n = table->CurrentColumn;
  column = (table->Columns).Data + column_n;
  text = "";
  if (label != (char *)0x0) {
    text = label;
  }
  text_end = FindRenderedTextEnd(text,(char *)0x0);
  IVar5 = CalcTextSize(text,text_end,true,-1.0);
  IVar4 = (this->DC).CursorPos;
  local_e8 = (long)column_n;
  label_pos = IVar4;
  label_size = IVar5;
  IVar16 = TableGetCellBgRect(table,column_n);
  local_98 = IVar5.x;
  fStack_94 = IVar5.y;
  local_b8 = IVar16.Max.x;
  fStack_b4 = IVar16.Max.y;
  fVar12 = table->RowMinHeight - (table->CellPaddingY + table->CellPaddingY);
  uVar10 = -(uint)(fVar12 <= fStack_94);
  local_58 = ZEXT416(~uVar10 & (uint)fVar12 | (uint)fStack_94 & uVar10);
  sort_order_suf[0] = '\0';
  sort_order_suf[1] = '\0';
  sort_order_suf[2] = '\0';
  sort_order_suf[3] = '\0';
  fVar12 = 0.0;
  pIVar9 = local_f0;
  if (((table->Flags & 8) == 0) || ((column->Flags & 0x200) != 0)) {
    fVar13 = 0.0;
  }
  else {
    fVar13 = (float)(int)(local_f0->FontSize * 0.65 + (local_f0->Style).FramePadding.x);
    if ('\0' < column->SortOrder) {
      ImFormatString(sort_order_suf,4,"%d");
      pIVar9 = local_f0;
      local_f4 = (local_f0->Style).ItemInnerSpacing.x;
      IVar5 = CalcTextSize(sort_order_suf,(char *)0x0,false,-1.0);
      fVar12 = IVar5.x + local_f4;
    }
  }
  fVar15 = local_98 + IVar4.x + fVar12 + fVar13;
  uVar2 = column->ContentMaxXHeadersUsed;
  uVar3 = column->ContentMaxXHeadersIdeal;
  uVar10 = -(uint)(column->WorkMaxX <= (float)uVar2);
  uVar11 = -(uint)(fVar15 <= (float)uVar3);
  uVar14 = CONCAT44(~uVar11 & (uint)fVar15,~uVar10 & (uint)column->WorkMaxX) |
           CONCAT44(uVar3 & uVar11,uVar2 & uVar10);
  column->ContentMaxXHeadersUsed = (float)(int)uVar14;
  column->ContentMaxXHeadersIdeal = (float)(int)(uVar14 >> 0x20);
  if ((table->IsContextPopupOpen == true) && ((int)local_e8 == table->ContextPopupColumn)) {
    local_f4 = (float)(uint)CONCAT11((char)((ushort)table->InstanceInteracted >> 8),
                                     table->InstanceInteracted == table->InstanceCurrent);
  }
  else {
    local_f4 = 0.0;
  }
  id = ImGuiWindow::GetID(this,text,(char *)0x0);
  local_c8 = IVar16.Min.x;
  fStack_c4 = IVar16.Min.y;
  fVar15 = (pIVar9->Style).CellPadding.y;
  fVar15 = fVar15 + fVar15 + fStack_c4 + (float)local_58._0_4_;
  uVar10 = -(uint)(fVar15 <= fStack_b4);
  local_40.Max.y = (float)(uVar10 & (uint)fStack_b4 | ~uVar10 & (uint)fVar15);
  local_40.Min.x = local_c8;
  local_40.Min.y = fStack_c4;
  local_40.Max.x = local_b8;
  local_60.x = 0.0;
  local_60.y = (float)local_58._0_4_;
  ItemSize(&local_60,-1.0);
  bVar6 = ItemAdd(&local_40,id,(ImRect *)0x0,0);
  if (!bVar6) {
    return;
  }
  local_f5 = ButtonBehavior(&local_40,id,&hovered,&held,0x1000);
  if (pIVar9->ActiveId != id) {
    SetItemAllowOverlap();
  }
  if (((held | hovered | local_f4._0_1_) & 1) == 0) {
    if ((table->field_0x98 & 1) != 0) goto LAB_001314d5;
    uVar10 = 0x2a;
  }
  else {
    uVar10 = 0x1a;
    if (held == false) {
      uVar10 = hovered & 1 | 0x18;
    }
  }
  IVar7 = GetColorU32(uVar10,1.0);
  TableSetBgColor(3,IVar7,table->CurrentColumn);
LAB_001314d5:
  RenderNavHighlight(&local_40,id,10);
  if (held == true) {
    table->HeldHeaderColumn = (ImGuiTableColumnIdx)local_e8;
    (this->DC).CursorPos.y = (pIVar9->Style).ItemSpacing.y * -0.5 + (this->DC).CursorPos.y;
    if ((((table->Flags & 2) != 0) && (bVar6 = IsMouseDragging(0,-1.0), bVar6)) &&
       (pIVar9->DragDropActive == false)) {
      table->ReorderColumn = (ImGuiTableColumnIdx)local_e8;
      table->InstanceInteracted = table->InstanceCurrent;
      fVar15 = (pIVar9->IO).MouseDelta.x;
      if ((((fVar15 < 0.0) &&
           (pIVar1 = &(pIVar9->IO).MousePos, pIVar1->x <= local_c8 && local_c8 != pIVar1->x)) &&
          (((long)column->PrevEnabledColumn != -1 &&
           ((pIVar8 = (table->Columns).Data, pIVar8 != (ImGuiTableColumn *)0x0 &&
            (pIVar8 = pIVar8 + column->PrevEnabledColumn,
            ((pIVar8->Flags | column->Flags) & 0x40U) == 0)))))) &&
         (column->IndexWithinEnabledSet < table->FreezeColumnsRequest !=
          table->FreezeColumnsRequest <= pIVar8->IndexWithinEnabledSet)) {
        table->ReorderColumnDir = -1;
      }
      if (((((0.0 < fVar15) && (local_b8 < (pIVar9->IO).MousePos.x)) &&
           ((long)column->NextEnabledColumn != -1)) &&
          ((pIVar8 = (table->Columns).Data, pIVar8 != (ImGuiTableColumn *)0x0 &&
           (pIVar8 = pIVar8 + column->NextEnabledColumn,
           ((pIVar8->Flags | column->Flags) & 0x40U) == 0)))) &&
         (column->IndexWithinEnabledSet < table->FreezeColumnsRequest !=
          table->FreezeColumnsRequest <= pIVar8->IndexWithinEnabledSet)) {
        table->ReorderColumnDir = '\x01';
      }
    }
  }
  else {
    (this->DC).CursorPos.y = (pIVar9->Style).ItemSpacing.y * -0.5 + (this->DC).CursorPos.y;
  }
  local_d8 = IVar4.y;
  fVar13 = (local_b8 - fVar13) - fVar12;
  if (((table->Flags & 8) != 0) && ((column->Flags & 0x200) == 0)) {
    if (column->SortOrder != -1) {
      fVar15 = (float)(~-(uint)(fVar13 <= local_c8) & (uint)fVar13 |
                      (uint)local_c8 & -(uint)(fVar13 <= local_c8));
      if ('\0' < column->SortOrder) {
        IVar7 = GetColorU32(0,0.7);
        PushStyleColor(0,IVar7);
        IVar4.y = local_d8;
        IVar4.x = (pIVar9->Style).ItemInnerSpacing.x + fVar15;
        RenderText(IVar4,sort_order_suf,(char *)0x0,true);
        PopStyleColor(1);
        fVar15 = fVar15 + fVar12;
      }
      draw_list = this->DrawList;
      IVar7 = GetColorU32(0,1.0);
      IVar5.y = local_d8;
      IVar5.x = fVar15;
      RenderArrow(draw_list,IVar5,IVar7,(column->field_0x65 & 3) == 1 ^ 3,0.65);
      pIVar9 = local_f0;
    }
    if ((local_f5 != '\0') && ((int)local_e8 != table->ReorderColumn)) {
      sort_direction = TableGetColumnNextSortDirection(column);
      TableSetColumnSortDirection((int)local_e8,sort_direction,(pIVar9->IO).KeyShift);
    }
  }
  local_60.y = (float)local_58._0_4_ + local_d8 + (pIVar9->Style).FramePadding.y;
  local_60.x = fVar13;
  RenderTextEllipsis(this->DrawList,&label_pos,&local_60,fVar13,fVar13,text,text_end,&label_size);
  if (((fVar13 - label_pos.x < label_size.x) && (hovered == true)) &&
     (local_f0->TooltipSlowDelay <= local_f0->HoveredIdNotActiveTimer &&
      local_f0->HoveredIdNotActiveTimer != local_f0->TooltipSlowDelay)) {
    SetTooltip("%.*s",(ulong)(uint)((int)text_end - (int)text));
  }
  bVar6 = IsMouseReleased(1);
  if ((bVar6) && (bVar6 = IsItemHovered(0), bVar6)) {
    TableOpenContextMenu((int)local_e8);
  }
  return;
}

Assistant:

void ImGui::TableHeader(const char* label)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return;

    ImGuiTable* table = g.CurrentTable;
    IM_ASSERT(table != NULL && "Need to call TableHeader() after BeginTable()!");
    IM_ASSERT(table->CurrentColumn != -1);
    const int column_n = table->CurrentColumn;
    ImGuiTableColumn* column = &table->Columns[column_n];

    // Label
    if (label == NULL)
        label = "";
    const char* label_end = FindRenderedTextEnd(label);
    ImVec2 label_size = CalcTextSize(label, label_end, true);
    ImVec2 label_pos = window->DC.CursorPos;

    // If we already got a row height, there's use that.
    // FIXME-TABLE: Padding problem if the correct outer-padding CellBgRect strays off our ClipRect?
    ImRect cell_r = TableGetCellBgRect(table, column_n);
    float label_height = ImMax(label_size.y, table->RowMinHeight - table->CellPaddingY * 2.0f);

    // Calculate ideal size for sort order arrow
    float w_arrow = 0.0f;
    float w_sort_text = 0.0f;
    char sort_order_suf[4] = "";
    const float ARROW_SCALE = 0.65f;
    if ((table->Flags & ImGuiTableFlags_Sortable) && !(column->Flags & ImGuiTableColumnFlags_NoSort))
    {
        w_arrow = ImFloor(g.FontSize * ARROW_SCALE + g.Style.FramePadding.x);
        if (column->SortOrder > 0)
        {
            ImFormatString(sort_order_suf, IM_ARRAYSIZE(sort_order_suf), "%d", column->SortOrder + 1);
            w_sort_text = g.Style.ItemInnerSpacing.x + CalcTextSize(sort_order_suf).x;
        }
    }

    // We feed our unclipped width to the column without writing on CursorMaxPos, so that column is still considering for merging.
    float max_pos_x = label_pos.x + label_size.x + w_sort_text + w_arrow;
    column->ContentMaxXHeadersUsed = ImMax(column->ContentMaxXHeadersUsed, column->WorkMaxX);
    column->ContentMaxXHeadersIdeal = ImMax(column->ContentMaxXHeadersIdeal, max_pos_x);

    // Keep header highlighted when context menu is open.
    const bool selected = (table->IsContextPopupOpen && table->ContextPopupColumn == column_n && table->InstanceInteracted == table->InstanceCurrent);
    ImGuiID id = window->GetID(label);
    ImRect bb(cell_r.Min.x, cell_r.Min.y, cell_r.Max.x, ImMax(cell_r.Max.y, cell_r.Min.y + label_height + g.Style.CellPadding.y * 2.0f));
    ItemSize(ImVec2(0.0f, label_height)); // Don't declare unclipped width, it'll be fed ContentMaxPosHeadersIdeal
    if (!ItemAdd(bb, id))
        return;

    //GetForegroundDrawList()->AddRect(cell_r.Min, cell_r.Max, IM_COL32(255, 0, 0, 255)); // [DEBUG]
    //GetForegroundDrawList()->AddRect(bb.Min, bb.Max, IM_COL32(255, 0, 0, 255)); // [DEBUG]

    // Using AllowItemOverlap mode because we cover the whole cell, and we want user to be able to submit subsequent items.
    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held, ImGuiButtonFlags_AllowItemOverlap);
    if (g.ActiveId != id)
        SetItemAllowOverlap();
    if (held || hovered || selected)
    {
        const ImU32 col = GetColorU32(held ? ImGuiCol_HeaderActive : hovered ? ImGuiCol_HeaderHovered : ImGuiCol_Header);
        //RenderFrame(bb.Min, bb.Max, col, false, 0.0f);
        TableSetBgColor(ImGuiTableBgTarget_CellBg, col, table->CurrentColumn);
    }
    else
    {
        // Submit single cell bg color in the case we didn't submit a full header row
        if ((table->RowFlags & ImGuiTableRowFlags_Headers) == 0)
            TableSetBgColor(ImGuiTableBgTarget_CellBg, GetColorU32(ImGuiCol_TableHeaderBg), table->CurrentColumn);
    }
    RenderNavHighlight(bb, id, ImGuiNavHighlightFlags_TypeThin | ImGuiNavHighlightFlags_NoRounding);
    if (held)
        table->HeldHeaderColumn = (ImGuiTableColumnIdx)column_n;
    window->DC.CursorPos.y -= g.Style.ItemSpacing.y * 0.5f;

    // Drag and drop to re-order columns.
    // FIXME-TABLE: Scroll request while reordering a column and it lands out of the scrolling zone.
    if (held && (table->Flags & ImGuiTableFlags_Reorderable) && IsMouseDragging(0) && !g.DragDropActive)
    {
        // While moving a column it will jump on the other side of the mouse, so we also test for MouseDelta.x
        table->ReorderColumn = (ImGuiTableColumnIdx)column_n;
        table->InstanceInteracted = table->InstanceCurrent;

        // We don't reorder: through the frozen<>unfrozen line, or through a column that is marked with ImGuiTableColumnFlags_NoReorder.
        if (g.IO.MouseDelta.x < 0.0f && g.IO.MousePos.x < cell_r.Min.x)
            if (ImGuiTableColumn* prev_column = (column->PrevEnabledColumn != -1) ? &table->Columns[column->PrevEnabledColumn] : NULL)
                if (!((column->Flags | prev_column->Flags) & ImGuiTableColumnFlags_NoReorder))
                    if ((column->IndexWithinEnabledSet < table->FreezeColumnsRequest) == (prev_column->IndexWithinEnabledSet < table->FreezeColumnsRequest))
                        table->ReorderColumnDir = -1;
        if (g.IO.MouseDelta.x > 0.0f && g.IO.MousePos.x > cell_r.Max.x)
            if (ImGuiTableColumn* next_column = (column->NextEnabledColumn != -1) ? &table->Columns[column->NextEnabledColumn] : NULL)
                if (!((column->Flags | next_column->Flags) & ImGuiTableColumnFlags_NoReorder))
                    if ((column->IndexWithinEnabledSet < table->FreezeColumnsRequest) == (next_column->IndexWithinEnabledSet < table->FreezeColumnsRequest))
                        table->ReorderColumnDir = +1;
    }

    // Sort order arrow
    const float ellipsis_max = cell_r.Max.x - w_arrow - w_sort_text;
    if ((table->Flags & ImGuiTableFlags_Sortable) && !(column->Flags & ImGuiTableColumnFlags_NoSort))
    {
        if (column->SortOrder != -1)
        {
            float x = ImMax(cell_r.Min.x, cell_r.Max.x - w_arrow - w_sort_text);
            float y = label_pos.y;
            if (column->SortOrder > 0)
            {
                PushStyleColor(ImGuiCol_Text, GetColorU32(ImGuiCol_Text, 0.70f));
                RenderText(ImVec2(x + g.Style.ItemInnerSpacing.x, y), sort_order_suf);
                PopStyleColor();
                x += w_sort_text;
            }
            RenderArrow(window->DrawList, ImVec2(x, y), GetColorU32(ImGuiCol_Text), column->SortDirection == ImGuiSortDirection_Ascending ? ImGuiDir_Up : ImGuiDir_Down, ARROW_SCALE);
        }

        // Handle clicking on column header to adjust Sort Order
        if (pressed && table->ReorderColumn != column_n)
        {
            ImGuiSortDirection sort_direction = TableGetColumnNextSortDirection(column);
            TableSetColumnSortDirection(column_n, sort_direction, g.IO.KeyShift);
        }
    }

    // Render clipped label. Clipping here ensure that in the majority of situations, all our header cells will
    // be merged into a single draw call.
    //window->DrawList->AddCircleFilled(ImVec2(ellipsis_max, label_pos.y), 40, IM_COL32_WHITE);
    RenderTextEllipsis(window->DrawList, label_pos, ImVec2(ellipsis_max, label_pos.y + label_height + g.Style.FramePadding.y), ellipsis_max, ellipsis_max, label, label_end, &label_size);

    const bool text_clipped = label_size.x > (ellipsis_max - label_pos.x);
    if (text_clipped && hovered && g.HoveredIdNotActiveTimer > g.TooltipSlowDelay)
        SetTooltip("%.*s", (int)(label_end - label), label);

    // We don't use BeginPopupContextItem() because we want the popup to stay up even after the column is hidden
    if (IsMouseReleased(1) && IsItemHovered())
        TableOpenContextMenu(column_n);
}